

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O2

void Fl::copy_image(uchar *data,int W,int H,int clipboard)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  uchar *puVar5;
  uint uVar6;
  Atom AVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  bool bVar11;
  
  if ((0 < H && 0 < W) && data != (uchar *)0x0) {
    if (fl_selection_buffer[clipboard] != (char *)0x0) {
      operator_delete__(fl_selection_buffer[clipboard]);
    }
    uVar1 = W * 3;
    uVar6 = W * 3 + 3U & 0x7ffffffc;
    iVar2 = uVar6 * H;
    uVar10 = iVar2 + 0x36;
    pcVar3 = (char *)operator_new__((ulong)uVar10);
    pcVar3[0] = 'B';
    pcVar3[1] = 'M';
    pcVar3[2] = (char)uVar10;
    pcVar3[3] = (char)(uVar10 >> 8);
    pcVar3[4] = (char)(uVar10 >> 0x10);
    pcVar3[5] = (char)(uVar10 >> 0x18);
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\0';
    pcVar3[9] = '\0';
    pcVar3[10] = '6';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '(';
    pcVar3[0xf] = '\0';
    pcVar3[0x10] = '\0';
    pcVar3[0x11] = '\0';
    pcVar3[0x12] = (char)W;
    pcVar3[0x13] = (char)((uint)W >> 8);
    pcVar3[0x14] = (char)((uint)W >> 0x10);
    pcVar3[0x15] = (char)((uint)W >> 0x18);
    pcVar3[0x16] = (char)H;
    pcVar3[0x17] = (char)((uint)H >> 8);
    pcVar3[0x18] = (char)((uint)H >> 0x10);
    pcVar3[0x19] = (char)((uint)H >> 0x18);
    pcVar3[0x1a] = '\x01';
    pcVar3[0x1b] = '\0';
    pcVar3[0x1c] = '\x18';
    pcVar3[0x21] = '\0';
    pcVar3[0x1d] = '\0';
    pcVar3[0x1e] = '\0';
    pcVar3[0x1f] = '\0';
    pcVar3[0x20] = '\0';
    pcVar3[0x22] = (char)iVar2;
    pcVar3[0x23] = (char)((uint)iVar2 >> 8);
    pcVar3[0x24] = (char)((uint)iVar2 >> 0x10);
    pcVar3[0x25] = (char)((uint)iVar2 >> 0x18);
    pcVar3[0x26] = '\0';
    pcVar3[0x27] = '\0';
    pcVar3[0x28] = '\0';
    pcVar3[0x29] = '\0';
    pcVar3[0x2a] = '\0';
    pcVar3[0x2b] = '\0';
    pcVar3[0x2c] = '\0';
    pcVar3[0x2d] = '\0';
    pcVar3[0x2e] = '\0';
    pcVar3[0x2f] = '\0';
    pcVar3[0x30] = '\0';
    pcVar3[0x31] = '\0';
    pcVar3[0x32] = '\0';
    pcVar3[0x33] = '\0';
    pcVar3[0x34] = '\0';
    pcVar3[0x35] = '\0';
    pcVar4 = pcVar3 + 0x36;
    puVar5 = data + ((ulong)(uVar1 * H) - (ulong)uVar1) + 2;
    for (iVar2 = 0; iVar2 != H; iVar2 = iVar2 + 1) {
      lVar9 = 0;
      iVar8 = W;
      while (bVar11 = iVar8 != 0, iVar8 = iVar8 + -1, bVar11) {
        pcVar4[lVar9] = puVar5[lVar9];
        pcVar4[lVar9 + 1] = puVar5[lVar9 + -1];
        pcVar4[lVar9 + 2] = puVar5[lVar9 + -2];
        lVar9 = lVar9 + 3;
      }
      pcVar4 = pcVar4 + uVar6;
      puVar5 = puVar5 + -(ulong)uVar1;
    }
    fl_selection_length[clipboard] = uVar10;
    fl_selection_buffer[clipboard] = pcVar3;
    fl_selection_buffer_length[clipboard] = uVar10;
    fl_i_own_selection[clipboard] = '\x01';
    fl_selection_type[clipboard] = "image";
    AVar7 = CLIPBOARD;
    if (clipboard == 0) {
      AVar7 = 1;
    }
    XSetSelectionOwner(fl_display,AVar7,fl_message_window,fl_event_time);
    return;
  }
  return;
}

Assistant:

void Fl::copy_image(const unsigned char *data, int W, int H, int clipboard){
  if(!data || W<=0 || H<=0) return;
  delete[] fl_selection_buffer[clipboard];
  fl_selection_buffer[clipboard] = (char *) create_bmp(data,W,H,&fl_selection_length[clipboard]);
  fl_selection_buffer_length[clipboard] = fl_selection_length[clipboard];
  fl_i_own_selection[clipboard] = 1;
  fl_selection_type[clipboard] = Fl::clipboard_image;

  Atom property = clipboard ? CLIPBOARD : XA_PRIMARY;
  XSetSelectionOwner(fl_display, property, fl_message_window, fl_event_time);
}